

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O3

double __thiscall phyr::Shape::pdf(Shape *this,Interaction *ref,Vector3f *wi)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double tHit;
  Ray ray;
  SurfaceInteraction isectLight;
  undefined1 local_220 [8];
  Ray local_218;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  
  Interaction::emitRay(&local_218,ref,wi);
  memset(&local_1e0,0,0x1b0);
  iVar2 = (*this->_vptr_Shape[5])(this,&local_218,local_220,&local_1e0,1);
  dVar4 = 0.0;
  if ((char)iVar2 != '\0') {
    dVar3 = (ref->p).x - local_1e0;
    dVar5 = (ref->p).y - local_1d8;
    dVar7 = (ref->p).z - local_1d0;
    dVar4 = wi->x;
    dVar6 = wi->y;
    dVar1 = wi->z;
    (*this->_vptr_Shape[4])(this);
    dVar6 = (dVar7 * dVar7 + dVar3 * dVar3 + dVar5 * dVar5) /
            (extraout_XMM0_Qa * ABS((-dVar4 * local_1c8 - local_1c0 * dVar6) - local_1b8 * dVar1));
    dVar4 = 0.0;
    if (ABS(dVar6) != INFINITY) {
      dVar4 = dVar6;
    }
  }
  return dVar4;
}

Assistant:

Real Shape::pdf(const Interaction& ref, const Vector3f& wi) const {
    // Intersect sample ray with area light geometry
    Ray ray = ref.emitRay(wi);
    Real tHit;
    SurfaceInteraction isectLight;

    // Ignore any alpha textures used for trimming the shape when performing
    // this intersection.
    if (!intersectRay(ray, &tHit, &isectLight)) return 0;

    // Convert light sample weight to solid angle measure
    Real pdf = distanceSquared(ref.p, isectLight.p) / (absDot(isectLight.n, -wi) * surfaceArea());
    if (std::isinf(pdf)) pdf = 0.f;
    return pdf;
}